

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQInteger sqstd_rex_charnode(SQRex *exp,SQBool isclass)

{
  char cVar1;
  char cVar2;
  SQChar *pSVar3;
  int iVar4;
  SQInteger SVar5;
  SQInteger node_1;
  SQInteger node;
  SQChar ce;
  SQChar cb;
  SQChar t;
  SQBool isclass_local;
  SQRex *exp_local;
  
  if (*exp->_p == '\\') {
    exp->_p = exp->_p + 1;
    switch(*exp->_p) {
    case '\0':
      sqstd_rex_error(exp,"letter expected for argument of escape sequence");
      goto LAB_0014e992;
    case 'A':
    case 'C':
    case 'D':
    case 'P':
    case 'S':
    case 'W':
    case 'X':
    case 'a':
    case 'c':
    case 'd':
    case 'l':
    case 'p':
    case 's':
    case 'u':
    case 'w':
    case 'x':
      cVar2 = *exp->_p;
      exp->_p = exp->_p + 1;
      exp_local = (SQRex *)sqstd_rex_charclass(exp,(long)cVar2);
      break;
    case 'B':
    case 'b':
      if (isclass == 0) {
        SVar5 = sqstd_rex_newnode(exp,0x10c);
        exp->_nodes[SVar5].left = (long)*exp->_p;
        exp->_p = exp->_p + 1;
        return SVar5;
      }
    default:
      cVar2 = *exp->_p;
      exp->_p = exp->_p + 1;
      exp_local = (SQRex *)sqstd_rex_newnode(exp,(int)cVar2);
      break;
    case 'f':
      exp->_p = exp->_p + 1;
      exp_local = (SQRex *)sqstd_rex_newnode(exp,0xc);
      break;
    case 'm':
      pSVar3 = exp->_p;
      exp->_p = pSVar3 + 1;
      cVar2 = pSVar3[1];
      pSVar3 = exp->_p;
      exp->_p = pSVar3 + 1;
      cVar1 = pSVar3[1];
      exp->_p = exp->_p + 1;
      if ((cVar2 == '\0') || (cVar1 == '\0')) {
        sqstd_rex_error(exp,"balanced chars expected");
      }
      if (cVar2 == cVar1) {
        sqstd_rex_error(exp,"open/close char can\'t be the same");
      }
      exp_local = (SQRex *)sqstd_rex_newnode(exp,0x10d);
      exp->_nodes[(long)exp_local].left = (long)cVar2;
      exp->_nodes[(long)exp_local].right = (long)cVar1;
      break;
    case 'n':
      exp->_p = exp->_p + 1;
      exp_local = (SQRex *)sqstd_rex_newnode(exp,10);
      break;
    case 'r':
      exp->_p = exp->_p + 1;
      exp_local = (SQRex *)sqstd_rex_newnode(exp,0xd);
      break;
    case 't':
      exp->_p = exp->_p + 1;
      exp_local = (SQRex *)sqstd_rex_newnode(exp,9);
      break;
    case 'v':
      exp->_p = exp->_p + 1;
      exp_local = (SQRex *)sqstd_rex_newnode(exp,0xb);
    }
  }
  else {
    iVar4 = isprint((int)*exp->_p);
    if (iVar4 == 0) {
      sqstd_rex_error(exp,"letter expected");
    }
LAB_0014e992:
    cVar2 = *exp->_p;
    exp->_p = exp->_p + 1;
    exp_local = (SQRex *)sqstd_rex_newnode(exp,(int)cVar2);
  }
  return (SQInteger)exp_local;
}

Assistant:

static SQInteger sqstd_rex_charnode(SQRex *exp,SQBool isclass)
{
    SQChar t;
    if(*exp->_p == SQREX_SYMBOL_ESCAPE_CHAR) {
        exp->_p++;
        switch(*exp->_p) {
            case 'n': exp->_p++; return sqstd_rex_newnode(exp,'\n');
            case 't': exp->_p++; return sqstd_rex_newnode(exp,'\t');
            case 'r': exp->_p++; return sqstd_rex_newnode(exp,'\r');
            case 'f': exp->_p++; return sqstd_rex_newnode(exp,'\f');
            case 'v': exp->_p++; return sqstd_rex_newnode(exp,'\v');
            case 'a': case 'A': case 'w': case 'W': case 's': case 'S':
            case 'd': case 'D': case 'x': case 'X': case 'c': case 'C':
            case 'p': case 'P': case 'l': case 'u':
                {
                t = *exp->_p; exp->_p++;
                return sqstd_rex_charclass(exp,t);
                }
            case 'm':
                {
                     SQChar cb, ce; //cb = character begin match ce = character end match
                     cb = *++exp->_p; //skip 'm'
                     ce = *++exp->_p;
                     exp->_p++; //points to the next char to be parsed
                     if ((!cb) || (!ce)) sqstd_rex_error(exp,_SC("balanced chars expected"));
                     if ( cb == ce ) sqstd_rex_error(exp,_SC("open/close char can't be the same"));
                     SQInteger node =  sqstd_rex_newnode(exp,OP_MB);
                     exp->_nodes[node].left = cb;
                     exp->_nodes[node].right = ce;
                     return node;
                }
            case 0:
                sqstd_rex_error(exp,_SC("letter expected for argument of escape sequence"));
                break;
            case 'b':
            case 'B':
                if(!isclass) {
                    SQInteger node = sqstd_rex_newnode(exp,OP_WB);
                    exp->_nodes[node].left = *exp->_p;
                    exp->_p++;
                    return node;
                } //else default
            default:
                t = *exp->_p; exp->_p++;
                return sqstd_rex_newnode(exp,t);
        }
    }
    else if(!scisprint(*exp->_p)) {

        sqstd_rex_error(exp,_SC("letter expected"));
    }
    t = *exp->_p; exp->_p++;
    return sqstd_rex_newnode(exp,t);
}